

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

Gia_Man_t * Gia_QbfQuantifyOne(Gia_Man_t *p,int iVar,int fAndAll,int fOrAll)

{
  uint uVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *__dest;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  
  p_00 = Gia_ManStart(p->nObjs);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  iVar4 = pVVar8->nSize;
  iVar13 = p->nRegs;
  if (iVar13 < iVar4) {
    lVar17 = 0;
    do {
      if (iVar4 <= lVar17) goto LAB_0079632b;
      iVar4 = pVVar8->pArray[lVar17];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_007962ed;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) {
LAB_00796369:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_00796369;
      pGVar2[iVar4].Value = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar8 = p->vCis;
      iVar4 = pVVar8->nSize;
      iVar13 = p->nRegs;
    } while (lVar17 < iVar4 - iVar13);
  }
  iVar13 = p->vCos->nSize - iVar13;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar13 * 2 - 1U) {
    iVar4 = iVar13 * 2;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar4;
  if (iVar4 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar4 << 2);
  }
  pVVar8->pArray = piVar9;
  uVar5 = 0;
  do {
    iVar4 = p->vCis->nSize;
    if (iVar4 - p->nRegs <= iVar) {
      __assert_fail("v < Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
    }
    if ((iVar < 0) || (iVar4 <= iVar)) goto LAB_0079632b;
    iVar4 = p->vCis->pArray[(uint)iVar];
    if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_007962ed:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    p->pObjs[iVar4].Value = uVar5;
    if (0 < p->nObjs) {
      lVar15 = 8;
      lVar17 = 0;
      do {
        pGVar2 = p->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        uVar12 = *(ulong *)((long)pGVar2 + lVar15 + -8);
        if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
          uVar1 = *(uint *)((long)pGVar2 +
                           lVar15 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3);
          if (((int)uVar1 < 0) ||
             (uVar14 = *(uint *)((long)pGVar2 +
                                lVar15 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar14 < 0)) goto LAB_0079630c;
          iVar4 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar12 >> 0x1d) & 1,
                                 uVar14 ^ (uint)(uVar12 >> 0x3d) & 1);
          *(int *)(&pGVar2->field_0x0 + lVar15) = iVar4;
        }
        lVar17 = lVar17 + 1;
        lVar15 = lVar15 + 0xc;
      } while (lVar17 < p->nObjs);
    }
    pVVar10 = p->vCos;
    uVar12 = (ulong)(uint)pVVar10->nSize;
    if (p->nRegs < pVVar10->nSize) {
      lVar17 = 0;
      do {
        if ((int)uVar12 <= lVar17) goto LAB_0079632b;
        iVar4 = pVVar10->pArray[lVar17];
        if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_007962ed;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + iVar4;
        uVar14 = (uint)*(undefined8 *)pGVar2;
        uVar1 = pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value;
        if ((int)uVar1 < 0) {
LAB_0079630c:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Vec_IntPush(pVVar8,uVar14 >> 0x1d & 1 ^ uVar1);
        lVar17 = lVar17 + 1;
        pVVar10 = p->vCos;
        uVar12 = (ulong)pVVar10->nSize;
      } while (lVar17 < (long)(uVar12 - (long)p->nRegs));
    }
    bVar19 = uVar5 == 0;
    uVar5 = uVar5 + 1;
  } while (bVar19);
  if (fAndAll == 0) {
    if (fOrAll == 0) {
      iVar4 = pVVar8->nSize;
      if (0 < (long)iVar4) {
        piVar9 = pVVar8->pArray;
        lVar17 = 0;
        do {
          Gia_ManAppendCo(p_00,piVar9[lVar17]);
          lVar17 = lVar17 + 1;
        } while (iVar4 != lVar17);
      }
    }
    else {
      iVar4 = p->vCos->nSize;
      uVar5 = iVar4 - p->nRegs;
      uVar12 = (ulong)uVar5;
      if (uVar5 != 0 && p->nRegs <= iVar4) {
        uVar5 = pVVar8->nSize;
        uVar18 = 0;
        uVar16 = 0;
        if (0 < (int)uVar5) {
          uVar16 = (ulong)uVar5;
        }
        do {
          if (uVar16 == uVar18) goto LAB_0079632b;
          uVar12 = (uVar12 & 0xffffffff) + uVar18;
          iVar4 = (int)uVar12;
          if ((iVar4 < 0) || ((int)uVar5 <= iVar4)) goto LAB_0079632b;
          iVar4 = Gia_ManHashOr(p_00,pVVar8->pArray[uVar18],pVVar8->pArray[uVar12 & 0xffffffff]);
          Gia_ManAppendCo(p_00,iVar4);
          uVar18 = uVar18 + 1;
          uVar12 = (long)p->vCos->nSize - (long)p->nRegs;
        } while ((long)uVar18 < (long)uVar12);
      }
    }
  }
  else {
    iVar4 = p->vCos->nSize;
    uVar5 = iVar4 - p->nRegs;
    uVar12 = (ulong)uVar5;
    if (uVar5 != 0 && p->nRegs <= iVar4) {
      uVar5 = pVVar8->nSize;
      uVar18 = 0;
      uVar16 = 0;
      if (0 < (int)uVar5) {
        uVar16 = (ulong)uVar5;
      }
      do {
        if (uVar16 == uVar18) {
LAB_0079632b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar12 = (uVar12 & 0xffffffff) + uVar18;
        iVar4 = (int)uVar12;
        if ((iVar4 < 0) || ((int)uVar5 <= iVar4)) goto LAB_0079632b;
        iVar4 = Gia_ManHashAnd(p_00,pVVar8->pArray[uVar18],pVVar8->pArray[uVar12 & 0xffffffff]);
        Gia_ManAppendCo(p_00,iVar4);
        uVar18 = uVar18 + 1;
        uVar12 = (long)p->vCos->nSize - (long)p->nRegs;
      } while ((long)uVar18 < (long)uVar12);
    }
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_QbfQuantifyOne( Gia_Man_t * p, int iVar, int fAndAll, int fOrAll )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCofs;
    int i, c;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // compute cofactors
    vCofs = Vec_IntAlloc( 2 * Gia_ManPoNum(p) );
    for ( c = 0; c < 2; c++ )
    {
        Gia_ManPi(p, iVar)->Value = c;
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vCofs, Gia_ObjFanin0Copy(pObj) );
    }
    if ( fAndAll )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
            Gia_ManAppendCo( pNew, Gia_ManHashAnd(pNew, Vec_IntEntry(vCofs, i), Vec_IntEntry(vCofs, Gia_ManPoNum(p)+i)) );
    }
    else if ( fOrAll )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
            Gia_ManAppendCo( pNew, Gia_ManHashOr(pNew, Vec_IntEntry(vCofs, i), Vec_IntEntry(vCofs, Gia_ManPoNum(p)+i)) );
    }
    else
    {
        Vec_IntForEachEntry( vCofs, c, i )
            Gia_ManAppendCo( pNew, c );
    }
    Vec_IntFree( vCofs );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}